

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
* __thiscall
spvtools::opt::LoopFusion::LocationToMemOps
          (map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           *__return_storage_ptr__,LoopFusion *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *mem_ops)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  uint32_t id;
  DefUseManager *this_00;
  mapped_type *this_01;
  pointer ppIVar3;
  value_type *ppIVar4;
  Instruction *instruction;
  Instruction *local_40;
  Instruction *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppIVar2 = (mem_ops->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar3 = (mem_ops->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar3 != ppIVar2;
      ppIVar3 = ppIVar3 + 1) {
    local_38 = *ppIVar3;
    ppIVar4 = &local_38;
    do {
      this_00 = IRContext::get_def_use_mgr(this->context_);
      id = Instruction::GetSingleWordInOperand(*ppIVar4,0);
      local_40 = analysis::DefUseManager::GetDef(this_00,id);
      ppIVar4 = &local_40;
    } while (local_40->opcode_ == OpAccessChain);
    this_01 = std::
              map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
              ::operator[](__return_storage_ptr__,&local_40);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back(this_01,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<Instruction*, std::vector<Instruction*>> LoopFusion::LocationToMemOps(
    const std::vector<Instruction*>& mem_ops) {
  std::map<Instruction*, std::vector<Instruction*>> location_map{};

  for (auto instruction : mem_ops) {
    auto access_location = context_->get_def_use_mgr()->GetDef(
        instruction->GetSingleWordInOperand(0));

    while (access_location->opcode() == spv::Op::OpAccessChain) {
      access_location = context_->get_def_use_mgr()->GetDef(
          access_location->GetSingleWordInOperand(0));
    }

    location_map[access_location].push_back(instruction);
  }

  return location_map;
}